

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O3

void __thiscall
QGraphicsSceneLinearIndex::addItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  long in_FS_OFFSET;
  QGraphicsItem *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = item;
  QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
            ((QPodArrayOps<QGraphicsItem*> *)(this + 0x10),*(qsizetype *)(this + 0x20),&local_18);
  QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)(this + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual void addItem(QGraphicsItem *item) override
    { m_items << item; }